

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<IRR>::push(vec<IRR> *this,IRR *elem)

{
  uint uVar1;
  IRR *pIVar2;
  IntRelType IVar3;
  int iVar4;
  IRR *pIVar5;
  ulong uVar6;
  
  uVar1 = this->cap;
  if (this->sz == uVar1) {
    uVar6 = 2;
    if (1 < uVar1) {
      uVar6 = (ulong)(uVar1 * 3 + 1 >> 1);
    }
    this->cap = (uint)uVar6;
    pIVar5 = (IRR *)realloc(this->data,uVar6 << 5);
    this->data = pIVar5;
  }
  pIVar2 = this->data;
  uVar1 = this->sz;
  this->sz = uVar1 + 1;
  IVar3 = elem->t;
  iVar4 = elem->c;
  pIVar5 = pIVar2 + uVar1;
  pIVar5->x = elem->x;
  pIVar5->t = IVar3;
  pIVar5->c = iVar4;
  pIVar2[uVar1].r.super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020fb28;
  pIVar2[uVar1].r.s = (elem->r).s;
  pIVar2[uVar1].r.v = (elem->r).v;
  return;
}

Assistant:

void push(const T& elem) {
		if (sz == cap) {
			cap = cap <= 1 ? 2 : (cap * 3 + 1) >> 1;
			data = (T*)realloc((char*)data, cap * sizeof(T));
		}
		new (&data[sz++]) T(elem);
	}